

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.hpp
# Opt level: O0

void __thiscall SplayWeightConfiguration::~SplayWeightConfiguration(SplayWeightConfiguration *this)

{
  SplayWeightConfiguration *this_local;
  
  if ((this->momentSplay[0] != (Splay *)0x0) && (this->momentSplay[0] != (Splay *)0x0)) {
    operator_delete(this->momentSplay[0],0x10);
  }
  if ((this->momentSplay[1] != (Splay *)0x0) && (this->momentSplay[1] != (Splay *)0x0)) {
    operator_delete(this->momentSplay[1],0x10);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&this->cFac);
  std::vector<double,_std::allocator<double>_>::~vector(&this->fVal);
  std::vector<double,_std::allocator<double>_>::~vector(&this->spf);
  std::vector<double,_std::allocator<double>_>::~vector(&this->pf);
  std::vector<double,_std::allocator<double>_>::~vector(&this->aF);
  std::vector<double,_std::allocator<double>_>::~vector(&this->aL);
  std::vector<double,_std::allocator<double>_>::~vector(&this->aJ);
  std::vector<std::pair<bool,_double>,_std::allocator<std::pair<bool,_double>_>_>::~vector(&this->c)
  ;
  return;
}

Assistant:

~SplayWeightConfiguration() {
        if (momentSplay[0]) {
            delete momentSplay[0];
        }
        if (momentSplay[1]) {
            delete momentSplay[1];
        }
    }